

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort2.cpp
# Opt level: O1

void burstsort2_sampling_vector(uchar **strings,size_t n)

{
  byte bVar1;
  uchar *puVar2;
  pointer ppvVar3;
  ulong uVar4;
  bool bVar5;
  TrieNode<unsigned_char,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_> *root;
  undefined8 *puVar6;
  TrieNode<unsigned_char,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_> *this;
  int iVar7;
  _func_void_uchar_ptr_ptr_int_int *in_RCX;
  long lVar8;
  ulong uVar9;
  long lVar10;
  
  root = (TrieNode<unsigned_char,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_> *
         )operator_new(0x18);
  (root->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (root->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (root->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (n != 0) {
    lVar8 = 5000;
    in_RCX = (_func_void_uchar_ptr_ptr_int_int *)0x0;
    do {
      puVar2 = strings[(long)in_RCX];
      if (puVar2 == (uchar *)0x0) {
        __assert_fail("ptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                      ,0x26,"unsigned char get_char(unsigned char *, size_t)");
      }
      lVar10 = 0;
      this = root;
      do {
        bVar1 = puVar2[lVar10];
        uVar9 = (ulong)bVar1;
        if (bVar1 == 0) {
          bVar5 = false;
          iVar7 = 6;
        }
        else {
          if ((ulong)((long)(this->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 3) < uVar9 + 1) {
            std::vector<void_*,_std::allocator<void_*>_>::resize(&this->_buckets,uVar9 + 1);
          }
          lVar10 = lVar10 + 1;
          ppvVar3 = (this->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          if (((ulong)((long)(this->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>.
                             _M_impl.super__Vector_impl_data._M_finish - (long)ppvVar3 >> 3) <=
               uVar9) || (((ulong)ppvVar3[uVar9] & 1) == 0)) {
            puVar6 = (undefined8 *)operator_new(0x18);
            *puVar6 = 0;
            puVar6[1] = 0;
            puVar6[2] = 0;
            *(undefined8 **)
             ((long)(this->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                    super__Vector_impl_data._M_start + (ulong)((uint)bVar1 * 8)) = puVar6;
            ppvVar3 = (this->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                      super__Vector_impl_data._M_start;
            uVar4 = *(ulong *)((long)ppvVar3 + (ulong)((uint)bVar1 * 8));
            if (uVar4 == 0) {
              __assert_fail("ptr",
                            "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort2.cpp"
                            ,0x5c,"void make_trie(void *&)");
            }
            ppvVar3[uVar9] = (void *)(uVar4 | 1);
            lVar8 = lVar8 + -1;
            if (lVar8 == 0) {
              bVar5 = false;
              iVar7 = 7;
              lVar8 = 0;
              goto LAB_001a12da;
            }
          }
          this = TrieNode<unsigned_char,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_>
                 ::get_node(this,(uint)bVar1);
          if (this == (TrieNode<unsigned_char,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_>
                       *)0x0) {
            __assert_fail("node",
                          "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort2.cpp"
                          ,0xd9,
                          "TrieNode<CharT, BucketT> *pseudo_sample(unsigned char **, size_t) [CharT = unsigned char, BucketT = std::vector<unsigned char *>]"
                         );
          }
          iVar7 = 0;
          bVar5 = true;
        }
LAB_001a12da:
      } while (iVar7 == 0);
      if (iVar7 == 6) {
        bVar5 = true;
      }
      in_RCX = in_RCX + 0x2000;
    } while ((in_RCX < n) && (bVar5));
  }
  insert<8192u,std::vector<unsigned_char*,std::allocator<unsigned_char*>>,BurstSimple<unsigned_char>,unsigned_char>
            (root,strings,n);
  traverse<void(*)(unsigned_char**,int,int),std::vector<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_char>
            (root,strings,0,in_RCX);
  return;
}

Assistant:

void burstsort2_sampling_vector(unsigned char** strings, size_t n)
{
	typedef unsigned char CharT;
	typedef std::vector<unsigned char*> BucketT;
	typedef BurstSimple<CharT> BurstImpl;
	TrieNode<CharT, BucketT>* root = pseudo_sample<CharT, BucketT>(strings, n);
	insert<8192, BucketT, BurstImpl>(root, strings, n);
	traverse(root, strings, 0, SmallSort);
}